

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bloaty.cc
# Opt level: O1

void __thiscall
bloaty::RangeSink::AddFileRangeForVMAddr
          (RangeSink *this,char *analyzer,uint64_t label_from_vmaddr,string_view file_range)

{
  pointer ppVar1;
  bool verbose;
  bool bVar2;
  char *pcVar3;
  Nonnull<char_*> pcVar4;
  uint64_t filesize;
  uint64_t fileoff;
  size_t num_args;
  pointer ppVar5;
  string_view format;
  string label;
  string local_110;
  undefined1 *local_f0;
  undefined8 local_e8;
  undefined1 local_e0;
  undefined7 uStack_df;
  RangeSink *local_d0;
  long local_c8;
  Nonnull<char_*> pcStack_c0;
  long local_b8;
  Nonnull<char_*> local_b0;
  size_type local_a8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_a0;
  long local_90;
  Nonnull<char_*> pcStack_88;
  char local_80 [32];
  long local_60;
  Nonnull<char_*> local_58;
  char local_50 [32];
  
  filesize = file_range._M_len;
  fileoff = (long)file_range._M_str - (long)(this->file_->data_)._M_str;
  verbose = IsVerboseForFileRange(this,fileoff,filesize);
  if (verbose) {
    pcVar3 = GetDataSourceLabel(this->data_source_);
    printf("[%s, %s] AddFileRangeForVMAddr(%lx, [%lx, %zx])\n",pcVar3,analyzer,label_from_vmaddr,
           fileoff,filesize);
  }
  if (this->translator_ == (DualMap *)0x0) {
    __assert_fail("translator_",
                  "/workspace/llm4binary/github/license_c_cmakelists/google[P]bloaty/src/bloaty.cc",
                  0x4b7,
                  "void bloaty::RangeSink::AddFileRangeForVMAddr(const char *, uint64_t, string_view)"
                 );
  }
  ppVar5 = (this->outputs_).
           super__Vector_base<std::pair<bloaty::DualMap_*,_const_bloaty::NameMunger_*>,_std::allocator<std::pair<bloaty::DualMap_*,_const_bloaty::NameMunger_*>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  ppVar1 = (this->outputs_).
           super__Vector_base<std::pair<bloaty::DualMap_*,_const_bloaty::NameMunger_*>,_std::allocator<std::pair<bloaty::DualMap_*,_const_bloaty::NameMunger_*>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (ppVar5 != ppVar1) {
    local_d0 = this;
    do {
      local_110._M_dataplus._M_p = (pointer)&local_110.field_2;
      local_110._M_string_length = 0;
      local_110.field_2._M_local_buf[0] = '\0';
      bVar2 = RangeMap::TryGetLabel(&ppVar5->first->vm_map,label_from_vmaddr,&local_110);
      if (bVar2) {
        num_args = (size_t)verbose;
        bVar2 = RangeMap::AddRangeWithTranslation
                          (&ppVar5->first->file_map,fileoff,filesize,&local_110,
                           &local_d0->translator_->file_map,verbose,&ppVar5->first->vm_map);
        if (!bVar2 && 0 < verbose_level) {
          pcVar4 = absl::numbers_internal::FastIntToBuffer(fileoff,local_80);
          local_90 = (long)pcVar4 - (long)local_80;
          pcStack_88 = local_80;
          pcVar4 = absl::numbers_internal::FastIntToBuffer(filesize,local_50);
          local_b8 = (long)pcVar4 - (long)local_50;
          local_e8 = 0;
          local_e0 = 0;
          local_c8 = local_90;
          pcStack_c0 = pcStack_88;
          local_a8 = local_110._M_string_length;
          local_a0 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                      *)local_110._M_dataplus._M_p;
          format._M_str = (char *)&local_c8;
          format._M_len = (size_t)"File range ($0, $1) for label $2 extends beyond base map";
          local_f0 = &local_e0;
          local_b0 = local_50;
          local_60 = local_b8;
          local_58 = local_50;
          absl::substitute_internal::SubstituteAndAppendArray
                    ((substitute_internal *)&local_f0,(Nonnull<std::string_*>)0x38,format,
                     (Nullable<const_absl::string_view_*>)0x3,num_args);
          printf("WARNING: %s\n",local_f0);
          if (local_f0 != &local_e0) {
            operator_delete(local_f0,CONCAT71(uStack_df,local_e0) + 1);
          }
        }
      }
      else if (1 < verbose_level) {
        printf("No label found for vmaddr %lx\n",label_from_vmaddr);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_110._M_dataplus._M_p != &local_110.field_2) {
        operator_delete(local_110._M_dataplus._M_p,
                        CONCAT71(local_110.field_2._M_allocated_capacity._1_7_,
                                 local_110.field_2._M_local_buf[0]) + 1);
      }
      ppVar5 = ppVar5 + 1;
    } while (ppVar5 != ppVar1);
  }
  return;
}

Assistant:

void RangeSink::AddFileRangeForVMAddr(const char* analyzer,
                                      uint64_t label_from_vmaddr,
                                      string_view file_range) {
  uint64_t file_offset = file_range.data() - file_->data().data();
  bool verbose = IsVerboseForFileRange(file_offset, file_range.size());
  if (verbose) {
    printf("[%s, %s] AddFileRangeForVMAddr(%" PRIx64 ", [%" PRIx64 ", %zx])\n",
           GetDataSourceLabel(data_source_), analyzer, label_from_vmaddr,
           file_offset, file_range.size());
  }
  assert(translator_);
  for (auto& pair : outputs_) {
    std::string label;
    if (pair.first->vm_map.TryGetLabel(label_from_vmaddr, &label)) {
      bool ok = pair.first->file_map.AddRangeWithTranslation(
          file_offset, file_range.size(), label, translator_->file_map, verbose,
          &pair.first->vm_map);
      if (!ok) {
        WARN("File range ($0, $1) for label $2 extends beyond base map",
             file_offset, file_range.size(), label);
      }
    } else if (verbose_level > 1) {
      printf("No label found for vmaddr %" PRIx64 "\n", label_from_vmaddr);
    }
  }
}